

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

void __thiscall tcmalloc::PageHeap::PrependToFreeList(PageHeap *this,Span *span)

{
  uint64_t *puVar1;
  SpanSet *this_00;
  Span *list;
  pair<std::_Rb_tree_iterator<tcmalloc::SpanPtrWithLength>,_bool> pVar2;
  SpanPtrWithLength local_20;
  
  puVar1 = &(this->stats_).free_bytes + ((*(uint *)&span->field_0x28 & 0x3000000) != 0x1000000);
  *puVar1 = *puVar1 + span->length * 0x2000;
  local_20.length = span->length;
  if (0x80 < local_20.length) {
    this_00 = &this->large_returned_;
    if ((*(uint *)&span->field_0x28 & 0x3000000) != 0x2000000) {
      this_00 = &this->large_normal_;
    }
    local_20.span = span;
    pVar2 = std::
            _Rb_tree<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanPtrWithLength,_std::_Identity<tcmalloc::SpanPtrWithLength>,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
            ::_M_insert_unique<tcmalloc::SpanPtrWithLength>(&this_00->_M_t,&local_20);
    span->field_0x2b = span->field_0x2b | 8;
    span->field_4 = (anon_union_8_2_4d86d181_for_Span_4)pVar2.first._M_node;
    return;
  }
  list = (Span *)(Static::pageheap_ +
                 (long)((this->pagemap_cache_).array_ + local_20.length * 0xc + 0x686a));
  if ((*(uint *)&span->field_0x28 & 0x3000000) != 0x1000000) {
    list = (Span *)(Static::pageheap_ +
                   (long)((this->pagemap_cache_).array_ + local_20.length * 0xc + 0x6870));
  }
  DLL_Prepend(list,span);
  return;
}

Assistant:

void PageHeap::PrependToFreeList(Span* span) {
  ASSERT(lock_.IsHeld());
  ASSERT(span->location != Span::IN_USE);
  if (span->location == Span::ON_NORMAL_FREELIST)
    stats_.free_bytes += (span->length << kPageShift);
  else
    stats_.unmapped_bytes += (span->length << kPageShift);

  if (span->length > kMaxPages) {
    SpanSet *set = &large_normal_;
    if (span->location == Span::ON_RETURNED_FREELIST)
      set = &large_returned_;
    std::pair<SpanSetIter, bool> p =
        set->insert(SpanPtrWithLength(span));
    ASSERT(p.second); // We never have duplicates since span->start is unique.
    span->SetSpanSetIterator(p.first);
    return;
  }

  SpanList* list = &free_[span->length - 1];
  if (span->location == Span::ON_NORMAL_FREELIST) {
    DLL_Prepend(&list->normal, span);
  } else {
    DLL_Prepend(&list->returned, span);
  }
}